

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_interactor.cpp
# Opt level: O0

void Am_Animation_Start_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_40;
  Am_Time local_38 [3];
  byte local_19;
  bool once;
  Am_Time delay;
  Am_Object *inter_local;
  
  delay.data = (Am_Time_Data *)inter;
  pAVar2 = Am_Object::Get(inter,0xe9,0);
  Am_Time::Am_Time((Am_Time *)&stack0xffffffffffffffe8,pAVar2);
  pAVar2 = Am_Object::Get(inter,0xcb,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  local_19 = ~bVar1 & 1;
  Am_Time::Am_Time(local_38,(Am_Time *)&stack0xffffffffffffffe8);
  Am_Object::Am_Object(&local_40,inter);
  Am_Register_Timer(local_38,&local_40,0xe8,(bool)(local_19 & 1));
  Am_Object::~Am_Object(&local_40);
  Am_Time::~Am_Time(local_38);
  Am_Time::~Am_Time((Am_Time *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Animation_Start_Do,
                 (Am_Object inter))
{
  Am_Time delay = inter.Get(Am_REPEAT_DELAY);
  bool once = !(bool)inter.Get(Am_CONTINUOUS);
  Am_Register_Timer(delay, inter, Am_ANIMATION_METHOD, once);
}